

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  char cVar1;
  bool bVar2;
  xpath_value_type xVar3;
  size_t sVar4;
  long lVar5;
  char_t *to_00;
  size_t sVar6;
  char_t *pcVar7;
  char_t *pcVar8;
  char *str;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4c0;
  xpath_node local_478;
  undefined1 local_468 [8];
  xpath_node_set_raw ns_3;
  xpath_stack swapped_stack_5;
  xpath_allocator_capture cr_8;
  char_t *end_4;
  char_t *begin_3;
  xpath_string s_7;
  char_t *end_3;
  char_t *begin_2;
  xpath_string to;
  xpath_string from;
  xpath_string s_6;
  xpath_stack swapped_stack_4;
  xpath_allocator_capture cr_7;
  char_t *end_2;
  char_t *begin_1;
  xpath_string s_5;
  char_t *end_1;
  char_t *begin;
  xpath_string s_4;
  char_t *rend_2;
  char_t *rbegin_2;
  size_t end;
  size_t pos_3;
  double last;
  double first_1;
  size_t s_length_1;
  xpath_string s_3;
  xpath_stack swapped_stack_3;
  xpath_allocator_capture cr_6;
  char_t *rend_1;
  char_t *rbegin_1;
  size_t pos_2;
  double first;
  size_t s_length;
  xpath_string s_2;
  xpath_stack swapped_stack_2;
  xpath_allocator_capture cr_5;
  char_t *rend;
  char_t *rbegin;
  char_t *pos_1;
  xpath_string p_1;
  xpath_string s_1;
  xpath_stack swapped_stack_1;
  xpath_allocator_capture cr_4;
  char_t *pos;
  xpath_string p;
  xpath_string s;
  xpath_stack swapped_stack;
  xpath_allocator_capture cr_3;
  xpath_node na_5;
  xpath_node_set_raw ns_2;
  xpath_allocator_capture cr_2;
  xpath_node na_4;
  xpath_node na_3;
  xpath_node_set_raw ns_1;
  xpath_allocator_capture cr_1;
  xpath_node na_2;
  xpath_node na_1;
  xpath_node_set_raw ns;
  xpath_allocator_capture cr;
  xpath_node na;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  switch(this->_type) {
  case '\x12':
    xpath_string::from_const(__return_storage_ptr__,(this->_data).string);
    break;
  default:
    goto LAB_0054c590;
  case '\x14':
    cVar1 = this->_rettype;
    xVar3 = xpath_variable::type((this->_data).variable);
    if ((int)cVar1 != xVar3) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2b11,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x03') {
      pcVar7 = xpath_variable::get_string((this->_data).variable);
      xpath_string::from_const(__return_storage_ptr__,pcVar7);
      return __return_storage_ptr__;
    }
LAB_0054c590:
    cVar1 = this->_rettype;
    if (cVar1 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&swapped_stack_5.temp,stack->temp);
      ns_3._eos = (xpath_node *)stack->temp;
      swapped_stack_5.result = stack->result;
      eval_node_set((xpath_node_set_raw *)local_468,this,c,(xpath_stack *)&ns_3._eos,
                    nodeset_eval_first);
      bVar2 = xpath_node_set_raw::empty((xpath_node_set_raw *)local_468);
      if (bVar2) {
        xpath_string::xpath_string(__return_storage_ptr__);
      }
      else {
        local_478 = xpath_node_set_raw::first((xpath_node_set_raw *)local_468);
        string_value(__return_storage_ptr__,&local_478,stack->result);
      }
      xpath_allocator_capture::~xpath_allocator_capture
                ((xpath_allocator_capture *)&swapped_stack_5.temp);
    }
    else if (cVar1 == '\x02') {
      dVar10 = eval_number(this,c,stack);
      convert_number_to_string(__return_storage_ptr__,dVar10,stack->result);
    }
    else {
      if (cVar1 != '\x04') {
        __assert_fail("false && \"Wrong expression for return type string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2b32,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar2 = eval_boolean(this,c,stack);
      str = "false";
      if (bVar2) {
        str = "true";
      }
      xpath_string::from_const(__return_storage_ptr__,str);
    }
    break;
  case '\x19':
    cr._state._error = (bool *)(c->n)._node._root;
    pcVar7 = local_name((xpath_node *)&cr._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar7);
    break;
  case '\x1a':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&ns._eos,stack->result);
    eval_node_set((xpath_node_set_raw *)&na_1._attribute,this->_left,c,stack,nodeset_eval_first);
    join_0x00000010_0x00000000_ = xpath_node_set_raw::first((xpath_node_set_raw *)&na_1._attribute);
    pcVar7 = local_name((xpath_node *)&na_2._attribute);
    xpath_string::from_const(__return_storage_ptr__,pcVar7);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ns._eos);
    break;
  case '\x1b':
    cr_2._state._error = (bool *)(c->n)._node._root;
    na_4._node._root = (xml_node_struct *)(c->n)._attribute._attr;
    pcVar7 = namespace_uri((xpath_node *)&cr_2._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar7);
    break;
  case '\x1c':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&ns_2._eos,stack->result);
    eval_node_set((xpath_node_set_raw *)&na_5._attribute,this->_left,c,stack,nodeset_eval_first);
    join_0x00000010_0x00000000_ = xpath_node_set_raw::first((xpath_node_set_raw *)&na_5._attribute);
    pcVar7 = namespace_uri((xpath_node *)&cr_3._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar7);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ns_2._eos);
    break;
  case '\x1d':
    cr_1._state._error = (bool *)(c->n)._node._root;
    na_2._node._root = (xml_node_struct *)(c->n)._attribute._attr;
    pcVar7 = qualified_name((xpath_node *)&cr_1._state._error);
    xpath_string::from_const(__return_storage_ptr__,pcVar7);
    break;
  case '\x1e':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&ns_1._eos,stack->result);
    eval_node_set((xpath_node_set_raw *)&na_3._attribute,this->_left,c,stack,nodeset_eval_first);
    join_0x00000010_0x00000000_ = xpath_node_set_raw::first((xpath_node_set_raw *)&na_3._attribute);
    pcVar7 = qualified_name((xpath_node *)&na_4._attribute);
    xpath_string::from_const(__return_storage_ptr__,pcVar7);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ns_1._eos);
    break;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    break;
  case ' ':
    eval_string(__return_storage_ptr__,this->_left,c,stack);
    break;
  case '!':
    eval_string_concat(__return_storage_ptr__,this,c,stack);
    break;
  case '$':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack.temp,stack->temp);
    s._length_heap = (size_t)stack->temp;
    swapped_stack.result = stack->result;
    eval_string((xpath_string *)&p._length_heap,this->_left,c,(xpath_stack *)&s._length_heap);
    eval_string((xpath_string *)&pos,this->_right,c,(xpath_stack *)&s._length_heap);
    pcVar7 = xpath_string::c_str((xpath_string *)&p._length_heap);
    pcVar8 = xpath_string::c_str((xpath_string *)&pos);
    pcVar7 = find_substring(pcVar7,pcVar8);
    if (pcVar7 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar8 = xpath_string::c_str((xpath_string *)&p._length_heap);
      xpath_string::from_heap(__return_storage_ptr__,pcVar8,pcVar7,stack->result);
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack.temp);
    break;
  case '%':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_1.temp,stack->temp);
    s_1._length_heap = (size_t)stack->temp;
    swapped_stack_1.result = stack->result;
    eval_string((xpath_string *)&p_1._length_heap,this->_left,c,(xpath_stack *)&s_1._length_heap);
    eval_string((xpath_string *)&pos_1,this->_right,c,(xpath_stack *)&s_1._length_heap);
    pcVar7 = xpath_string::c_str((xpath_string *)&p_1._length_heap);
    pcVar8 = xpath_string::c_str((xpath_string *)&pos_1);
    pcVar7 = find_substring(pcVar7,pcVar8);
    if (pcVar7 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      sVar6 = xpath_string::length((xpath_string *)&pos_1);
      pcVar8 = xpath_string::c_str((xpath_string *)&p_1._length_heap);
      sVar4 = xpath_string::length((xpath_string *)&p_1._length_heap);
      bVar2 = xpath_string::uses_heap((xpath_string *)&p_1._length_heap);
      if (bVar2) {
        xpath_string::from_heap(__return_storage_ptr__,pcVar7 + sVar6,pcVar8 + sVar4,stack->result);
      }
      else {
        xpath_string::from_const(__return_storage_ptr__,pcVar7 + sVar6);
      }
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_1.temp);
    break;
  case '&':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_2.temp,stack->temp);
    s_2._length_heap = (size_t)stack->temp;
    swapped_stack_2.result = stack->result;
    eval_string((xpath_string *)&s_length,this->_left,c,(xpath_stack *)&s_2._length_heap);
    sVar6 = xpath_string::length((xpath_string *)&s_length);
    dVar10 = eval_number(this->_right,c,stack);
    dVar10 = round_nearest(dVar10);
    bVar2 = is_nan(dVar10);
    if (bVar2) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      lVar5 = sVar6 + 1;
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      if (dVar10 < (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) {
        if (1.0 <= dVar10) {
          local_4c0 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
        }
        else {
          local_4c0 = 1;
        }
        if (local_4c0 == 0 || sVar6 + 1 < local_4c0) {
          __assert_fail("1 <= pos && pos <= s_length + 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x2ab6,
                        "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                       );
        }
        pcVar7 = xpath_string::c_str((xpath_string *)&s_length);
        pcVar8 = xpath_string::c_str((xpath_string *)&s_length);
        sVar6 = xpath_string::length((xpath_string *)&s_length);
        bVar2 = xpath_string::uses_heap((xpath_string *)&s_length);
        if (bVar2) {
          xpath_string::from_heap
                    (__return_storage_ptr__,pcVar7 + (local_4c0 - 1),pcVar8 + sVar6,stack->result);
        }
        else {
          xpath_string::from_const(__return_storage_ptr__,pcVar7 + (local_4c0 - 1));
        }
      }
      else {
        xpath_string::xpath_string(__return_storage_ptr__);
      }
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_2.temp);
    break;
  case '\'':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_3.temp,stack->temp);
    s_3._length_heap = (size_t)stack->temp;
    swapped_stack_3.result = stack->result;
    eval_string((xpath_string *)&s_length_1,this->_left,c,(xpath_stack *)&s_3._length_heap);
    sVar6 = xpath_string::length((xpath_string *)&s_length_1);
    dVar10 = eval_number(this->_right,c,stack);
    dVar10 = round_nearest(dVar10);
    dVar9 = eval_number(this->_right->_next,c,stack);
    dVar9 = round_nearest(dVar9);
    dVar9 = dVar10 + dVar9;
    bVar2 = is_nan(dVar10);
    if ((bVar2) || (bVar2 = is_nan(dVar9), bVar2)) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      lVar5 = sVar6 + 1;
      auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar12._0_8_ = lVar5;
      auVar12._12_4_ = 0x45300000;
      if (dVar10 < (auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) {
        if (dVar10 < dVar9) {
          if (1.0 <= dVar9) {
            if (1.0 <= dVar10) {
              local_4e0 = (long)dVar10 |
                          (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
            }
            else {
              local_4e0 = 1;
            }
            lVar5 = sVar6 + 1;
            auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
            auVar13._0_8_ = lVar5;
            auVar13._12_4_ = 0x45300000;
            if (dVar9 < (auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) {
              local_4e8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
            }
            else {
              local_4e8 = sVar6 + 1;
            }
            bVar2 = false;
            if ((local_4e0 != 0) && (bVar2 = false, local_4e0 <= local_4e8)) {
              bVar2 = local_4e8 <= sVar6 + 1;
            }
            if (!bVar2) {
              __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                            ,0x2ad2,
                            "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                           );
            }
            pcVar7 = xpath_string::c_str((xpath_string *)&s_length_1);
            pcVar8 = xpath_string::c_str((xpath_string *)&s_length_1);
            s_4._length_heap = (size_t)(pcVar8 + (local_4e8 - 1));
            if ((local_4e8 != sVar6 + 1) ||
               (bVar2 = xpath_string::uses_heap((xpath_string *)&s_length_1), bVar2)) {
              xpath_string::from_heap
                        (__return_storage_ptr__,pcVar7 + (local_4e0 - 1),(char_t *)s_4._length_heap,
                         stack->result);
            }
            else {
              xpath_string::from_const(__return_storage_ptr__,pcVar7 + (local_4e0 - 1));
            }
          }
          else {
            xpath_string::xpath_string(__return_storage_ptr__);
          }
        }
        else {
          xpath_string::xpath_string(__return_storage_ptr__);
        }
      }
      else {
        xpath_string::xpath_string(__return_storage_ptr__);
      }
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_3.temp);
    break;
  case '*':
    string_value((xpath_string *)&begin,&c->n,stack->result);
    pcVar7 = xpath_string::data((xpath_string *)&begin,stack->result);
    if (pcVar7 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      s_5._length_heap = (size_t)normalize_space(pcVar7);
      xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar7,(char_t *)s_5._length_heap)
      ;
    }
    break;
  case '+':
    eval_string((xpath_string *)&begin_1,this->_left,c,stack);
    pcVar7 = xpath_string::data((xpath_string *)&begin_1,stack->result);
    if (pcVar7 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar8 = normalize_space(pcVar7);
      xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar7,pcVar8);
    }
    break;
  case ',':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_4.temp,stack->temp);
    s_6._length_heap = (size_t)stack->temp;
    swapped_stack_4.result = stack->result;
    eval_string((xpath_string *)&from._length_heap,this->_left,c,stack);
    eval_string((xpath_string *)&to._length_heap,this->_right,c,(xpath_stack *)&s_6._length_heap);
    eval_string((xpath_string *)&begin_2,this->_right->_next,c,(xpath_stack *)&s_6._length_heap);
    pcVar7 = xpath_string::data((xpath_string *)&from._length_heap,stack->result);
    if (pcVar7 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar8 = xpath_string::c_str((xpath_string *)&to._length_heap);
      to_00 = xpath_string::c_str((xpath_string *)&begin_2);
      sVar6 = xpath_string::length((xpath_string *)&begin_2);
      s_7._length_heap = (size_t)translate(pcVar7,pcVar8,to_00,sVar6);
      xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar7,(char_t *)s_7._length_heap)
      ;
    }
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack_4.temp);
    break;
  case ':':
    eval_string((xpath_string *)&begin_3,this->_left,c,stack);
    pcVar7 = xpath_string::data((xpath_string *)&begin_3,stack->result);
    if (pcVar7 == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      pcVar8 = translate_table(pcVar7,(this->_data).table);
      xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar7,pcVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}